

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volume.cpp
# Opt level: O0

bool __thiscall GT7VolumeFile::parseHeader(GT7VolumeFile *this,uint8_t *header,uint64_t headerSize)

{
  bool bVar1;
  undefined1 uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  string *filePath;
  VolumeFile *in_RDI;
  value_type *streamDesc;
  VolumeInfo *volumeInfo_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<GT7VolumeFile::VolumeInfo,_std::allocator<GT7VolumeFile::VolumeInfo>_> *__range1_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  VolumeInfo *volumeInfo;
  iterator __end1;
  iterator __begin1;
  vector<GT7VolumeFile::VolumeInfo,_std::allocator<GT7VolumeFile::VolumeInfo>_> *__range1;
  uint volumeCount;
  uint dataSize;
  uint zDataSize;
  uint seed;
  uint hdr_0x1D8;
  uint hdr_0x1D4;
  uint hdr_0x1D0;
  uint hdr_0x1CC;
  uint magic;
  unsigned_long headerSizeAligned;
  uint8_t *p;
  undefined6 in_stack_fffffffffffffe68;
  undefined1 in_stack_fffffffffffffe6e;
  undefined1 in_stack_fffffffffffffe6f;
  StreamDesc *in_stack_fffffffffffffe70;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffe78;
  GT7VolumeFile *this_00;
  undefined7 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe87;
  unsigned_long in_stack_fffffffffffffe88;
  VolumeFile *this_01;
  VolumeInfo *in_stack_fffffffffffffe90;
  __normal_iterator<GT7VolumeFile::VolumeInfo_*,_std::vector<GT7VolumeFile::VolumeInfo,_std::allocator<GT7VolumeFile::VolumeInfo>_>_>
  in_stack_fffffffffffffe98;
  ifstream *stream;
  undefined7 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffeb8;
  uint local_130;
  uint local_12c;
  uint local_128;
  uint local_124;
  path local_f8;
  reference local_d8;
  reference local_d0;
  VolumeInfo *local_c8;
  __normal_iterator<GT7VolumeFile::VolumeInfo_*,_std::vector<GT7VolumeFile::VolumeInfo,_std::allocator<GT7VolumeFile::VolumeInfo>_>_>
  local_c0;
  VolumeFile *local_b8;
  undefined4 local_b0;
  undefined8 local_88;
  undefined8 local_80;
  iterator local_78;
  VolumeFile *local_70;
  undefined8 local_68;
  undefined8 local_60;
  uint local_54;
  uint local_50;
  uint local_4c;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  uint local_38;
  uint local_34;
  streamsize local_30;
  byte local_1;
  
  local_30 = 0x800;
  bVar1 = VolumeFile::needSwapEndian(in_RDI);
  if (bVar1) {
    local_124 = readNextWithByteSwap<unsigned_int,unsigned_char>
                          ((uchar **)in_stack_fffffffffffffe70);
  }
  else {
    local_124 = readNext<unsigned_int,unsigned_char>((uchar **)in_stack_fffffffffffffe70);
  }
  local_34 = local_124;
  if (local_124 == 0x5b745162) {
    bVar1 = VolumeFile::needSwapEndian(in_RDI);
    if (bVar1) {
      local_128 = readNextWithByteSwap<unsigned_int,unsigned_char>
                            ((uchar **)in_stack_fffffffffffffe70);
    }
    else {
      local_128 = readNext<unsigned_int,unsigned_char>((uchar **)in_stack_fffffffffffffe70);
    }
    local_38 = local_128;
    bVar1 = VolumeFile::needSwapEndian(in_RDI);
    if (bVar1) {
      local_12c = readNextWithByteSwap<unsigned_int,unsigned_char>
                            ((uchar **)in_stack_fffffffffffffe70);
    }
    else {
      local_12c = readNext<unsigned_int,unsigned_char>((uchar **)in_stack_fffffffffffffe70);
    }
    local_3c = local_12c;
    bVar1 = VolumeFile::needSwapEndian(in_RDI);
    if (bVar1) {
      local_130 = readNextWithByteSwap<unsigned_int,unsigned_char>
                            ((uchar **)in_stack_fffffffffffffe70);
    }
    else {
      local_130 = readNext<unsigned_int,unsigned_char>((uchar **)in_stack_fffffffffffffe70);
    }
    local_40 = local_130;
    bVar1 = VolumeFile::needSwapEndian(in_RDI);
    if (bVar1) {
      uVar3 = readNextWithByteSwap<unsigned_int,unsigned_char>((uchar **)in_stack_fffffffffffffe70);
    }
    else {
      uVar3 = readNext<unsigned_int,unsigned_char>((uchar **)in_stack_fffffffffffffe70);
    }
    local_44 = uVar3;
    advancePointerInplace<unsigned_char>
              ((uchar **)in_stack_fffffffffffffe70,
               CONCAT17(in_stack_fffffffffffffe6f,
                        CONCAT16(in_stack_fffffffffffffe6e,in_stack_fffffffffffffe68)));
    bVar1 = VolumeFile::needSwapEndian(in_RDI);
    if (bVar1) {
      uVar4 = readNextWithByteSwap<unsigned_int,unsigned_char>((uchar **)in_stack_fffffffffffffe70);
    }
    else {
      uVar4 = readNext<unsigned_int,unsigned_char>((uchar **)in_stack_fffffffffffffe70);
    }
    local_48 = uVar4;
    bVar1 = VolumeFile::needSwapEndian(in_RDI);
    if (bVar1) {
      uVar5 = readNextWithByteSwap<unsigned_int,unsigned_char>((uchar **)in_stack_fffffffffffffe70);
    }
    else {
      uVar5 = readNext<unsigned_int,unsigned_char>((uchar **)in_stack_fffffffffffffe70);
    }
    local_4c = uVar5;
    bVar1 = VolumeFile::needSwapEndian(in_RDI);
    if (bVar1) {
      uVar6 = readNextWithByteSwap<unsigned_int,unsigned_char>((uchar **)in_stack_fffffffffffffe70);
    }
    else {
      uVar6 = readNext<unsigned_int,unsigned_char>((uchar **)in_stack_fffffffffffffe70);
    }
    local_50 = uVar6;
    bVar1 = VolumeFile::needSwapEndian(in_RDI);
    if (bVar1) {
      uVar7 = readNextWithByteSwap<unsigned_int,unsigned_char>((uchar **)in_stack_fffffffffffffe70);
    }
    else {
      uVar7 = readNext<unsigned_int,unsigned_char>((uchar **)in_stack_fffffffffffffe70);
    }
    local_54 = uVar7;
    std::vector<GT7VolumeFile::VolumeInfo,_std::allocator<GT7VolumeFile::VolumeInfo>_>::resize
              ((vector<GT7VolumeFile::VolumeInfo,_std::allocator<GT7VolumeFile::VolumeInfo>_> *)
               in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    std::vector<GT7VolumeFile::VolumeInfo,_std::allocator<GT7VolumeFile::VolumeInfo>_>::size
              ((vector<GT7VolumeFile::VolumeInfo,_std::allocator<GT7VolumeFile::VolumeInfo>_> *)
               (in_RDI + 1));
    local_60 = std::vector<GT7VolumeFile::VolumeInfo,_std::allocator<GT7VolumeFile::VolumeInfo>_>::
               begin((vector<GT7VolumeFile::VolumeInfo,_std::allocator<GT7VolumeFile::VolumeInfo>_>
                      *)CONCAT17(in_stack_fffffffffffffe6f,
                                 CONCAT16(in_stack_fffffffffffffe6e,in_stack_fffffffffffffe68)));
    local_68 = std::
               copy_n<GT7VolumeFile::VolumeInfo_const*,unsigned_long,__gnu_cxx::__normal_iterator<GT7VolumeFile::VolumeInfo*,std::vector<GT7VolumeFile::VolumeInfo,std::allocator<GT7VolumeFile::VolumeInfo>>>>
                         (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                          in_stack_fffffffffffffe98);
    local_70 = in_RDI + 1;
    local_78 = std::vector<GT7VolumeFile::VolumeInfo,_std::allocator<GT7VolumeFile::VolumeInfo>_>::
               begin((vector<GT7VolumeFile::VolumeInfo,_std::allocator<GT7VolumeFile::VolumeInfo>_>
                      *)CONCAT17(in_stack_fffffffffffffe6f,
                                 CONCAT16(in_stack_fffffffffffffe6e,in_stack_fffffffffffffe68)));
    local_80 = std::vector<GT7VolumeFile::VolumeInfo,_std::allocator<GT7VolumeFile::VolumeInfo>_>::
               end((vector<GT7VolumeFile::VolumeInfo,_std::allocator<GT7VolumeFile::VolumeInfo>_> *)
                   CONCAT17(in_stack_fffffffffffffe6f,
                            CONCAT16(in_stack_fffffffffffffe6e,in_stack_fffffffffffffe68)));
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<GT7VolumeFile::VolumeInfo_*,_std::vector<GT7VolumeFile::VolumeInfo,_std::allocator<GT7VolumeFile::VolumeInfo>_>_>
                          *)in_stack_fffffffffffffe70,
                         (__normal_iterator<GT7VolumeFile::VolumeInfo_*,_std::vector<GT7VolumeFile::VolumeInfo,_std::allocator<GT7VolumeFile::VolumeInfo>_>_>
                          *)CONCAT17(in_stack_fffffffffffffe6f,
                                     CONCAT16(in_stack_fffffffffffffe6e,in_stack_fffffffffffffe68)))
      ;
      if (!bVar1) break;
      local_88 = __gnu_cxx::
                 __normal_iterator<GT7VolumeFile::VolumeInfo_*,_std::vector<GT7VolumeFile::VolumeInfo,_std::allocator<GT7VolumeFile::VolumeInfo>_>_>
                 ::operator*(&stack0xffffffffffffff88);
      ((reference)local_88)->fileSize =
           ((reference)local_88)->fileSize >> 0x20 | ((reference)local_88)->fileSize << 0x20;
      __gnu_cxx::
      __normal_iterator<GT7VolumeFile::VolumeInfo_*,_std::vector<GT7VolumeFile::VolumeInfo,_std::allocator<GT7VolumeFile::VolumeInfo>_>_>
      ::operator++(&stack0xffffffffffffff88);
    }
    stream = (ifstream *)&stack0xffffffffffffff60;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x134905);
    uVar2 = VolumeFile::readDataAt
                      ((VolumeFile *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                       in_stack_fffffffffffffe78,(uint64_t)in_stack_fffffffffffffe70,
                       CONCAT17(in_stack_fffffffffffffe6f,
                                CONCAT16(in_stack_fffffffffffffe6e,in_stack_fffffffffffffe68)));
    if ((bool)uVar2) {
      this_01 = (VolumeFile *)&stack0xffffffffffffff60;
      filePath = (string *)
                 std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x134975);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_01);
      VolumeFile::decryptData
                (this_01,(uint8_t *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                 (uint64_t)in_stack_fffffffffffffe78,
                 (uint32_t)((ulong)in_stack_fffffffffffffe70 >> 0x20));
      in_stack_fffffffffffffe87 =
           VolumeFile::inflateDataIfNeeded
                     ((VolumeFile *)CONCAT44(uVar3,uVar4),
                      (vector<unsigned_char,_std::allocator<unsigned_char>_> *)CONCAT44(uVar5,uVar6)
                      ,CONCAT44(uVar7,in_stack_fffffffffffffeb8));
      if ((bool)in_stack_fffffffffffffe87) {
        in_RDI->m_dataOffset = 0;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::swap
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                   in_stack_fffffffffffffe78);
        local_b8 = in_RDI + 1;
        local_c0._M_current =
             (VolumeInfo *)
             std::vector<GT7VolumeFile::VolumeInfo,_std::allocator<GT7VolumeFile::VolumeInfo>_>::
             begin((vector<GT7VolumeFile::VolumeInfo,_std::allocator<GT7VolumeFile::VolumeInfo>_> *)
                   CONCAT17(in_stack_fffffffffffffe6f,
                            CONCAT16(in_stack_fffffffffffffe6e,in_stack_fffffffffffffe68)));
        local_c8 = (VolumeInfo *)
                   std::
                   vector<GT7VolumeFile::VolumeInfo,_std::allocator<GT7VolumeFile::VolumeInfo>_>::
                   end((vector<GT7VolumeFile::VolumeInfo,_std::allocator<GT7VolumeFile::VolumeInfo>_>
                        *)CONCAT17(in_stack_fffffffffffffe6f,
                                   CONCAT16(in_stack_fffffffffffffe6e,in_stack_fffffffffffffe68)));
        while( true ) {
          bVar1 = __gnu_cxx::operator!=
                            ((__normal_iterator<GT7VolumeFile::VolumeInfo_*,_std::vector<GT7VolumeFile::VolumeInfo,_std::allocator<GT7VolumeFile::VolumeInfo>_>_>
                              *)in_stack_fffffffffffffe70,
                             (__normal_iterator<GT7VolumeFile::VolumeInfo_*,_std::vector<GT7VolumeFile::VolumeInfo,_std::allocator<GT7VolumeFile::VolumeInfo>_>_>
                              *)CONCAT17(in_stack_fffffffffffffe6f,
                                         CONCAT16(in_stack_fffffffffffffe6e,
                                                  in_stack_fffffffffffffe68)));
          if (!bVar1) break;
          local_d0 = __gnu_cxx::
                     __normal_iterator<GT7VolumeFile::VolumeInfo_*,_std::vector<GT7VolumeFile::VolumeInfo,_std::allocator<GT7VolumeFile::VolumeInfo>_>_>
                     ::operator*(&local_c0);
          std::vector<VolumeFile::StreamDesc,_std::allocator<VolumeFile::StreamDesc>_>::
          emplace_back<>((vector<VolumeFile::StreamDesc,_std::allocator<VolumeFile::StreamDesc>_> *)
                         in_stack_fffffffffffffe70);
          local_d8 = std::vector<VolumeFile::StreamDesc,_std::allocator<VolumeFile::StreamDesc>_>::
                     back((vector<VolumeFile::StreamDesc,_std::allocator<VolumeFile::StreamDesc>_> *
                          )in_stack_fffffffffffffe70);
          this_00 = (GT7VolumeFile *)&in_RDI->m_basePath;
          boost::filesystem::path::path
                    ((path *)CONCAT17(uVar2,in_stack_fffffffffffffea0),(value_type *)stream);
          boost::filesystem::operator/((path *)stream,(path *)filePath);
          in_stack_fffffffffffffe70 =
               (StreamDesc *)boost::filesystem::path::string_abi_cxx11_(&local_f8);
          std::__cxx11::string::operator=
                    ((string *)&local_d8->filePath,(string *)in_stack_fffffffffffffe70);
          boost::filesystem::path::~path((path *)0x134b22);
          boost::filesystem::path::~path((path *)0x134b2f);
          in_stack_fffffffffffffe6f = prepareStream(stream,filePath,(uint64_t *)this_01);
          if (!(bool)in_stack_fffffffffffffe6f) {
            local_1 = 0;
            goto LAB_00134c1c;
          }
          in_stack_fffffffffffffe6e = parseExtendedHeader(this_00,in_stack_fffffffffffffe70);
          if (!(bool)in_stack_fffffffffffffe6e) {
            local_1 = 0;
            goto LAB_00134c1c;
          }
          __gnu_cxx::
          __normal_iterator<GT7VolumeFile::VolumeInfo_*,_std::vector<GT7VolumeFile::VolumeInfo,_std::allocator<GT7VolumeFile::VolumeInfo>_>_>
          ::operator++(&local_c0);
        }
        local_1 = 1;
      }
      else {
        local_1 = 0;
      }
    }
    else {
      local_1 = 0;
    }
LAB_00134c1c:
    local_b0 = 1;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
  }
  else {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool GT7VolumeFile::parseHeader(const uint8_t* header, uint64_t headerSize)
{
	const auto* p = header;

	const auto headerSizeAligned = SEGMENT_SIZE;

	const auto magic = VOLUME_READ_NEXT_SELF(p, uint32_t);
	if (magic != HEADER_MAGIC) {
		return false;
	}

	// TODO: figure out what are these fields
	const auto hdr_0x1CC = VOLUME_READ_NEXT_SELF(p, uint32_t); // 0x04
	const auto hdr_0x1D0 = VOLUME_READ_NEXT_SELF(p, uint32_t); // 0x08
	const auto hdr_0x1D4 = VOLUME_READ_NEXT_SELF(p, uint32_t); // 0x0C
	const auto hdr_0x1D8 = VOLUME_READ_NEXT_SELF(p, uint32_t); // 0x10

	advancePointerInplace(p, 0xDC);

	const auto seed = VOLUME_READ_NEXT_SELF(p, uint32_t);
	const auto zDataSize = VOLUME_READ_NEXT_SELF(p, uint32_t); // with header
	const auto dataSize = VOLUME_READ_NEXT_SELF(p, uint32_t);
	const auto volumeCount = VOLUME_READ_NEXT_SELF(p, uint32_t);

	m_volumes.resize(volumeCount);
	std::copy_n(reinterpret_cast<const VolumeInfo*>(p), m_volumes.size(), m_volumes.begin());
	for (auto& volumeInfo: m_volumes) {
		volumeInfo.fileSize = (volumeInfo.fileSize >> 32) | ((volumeInfo.fileSize & 0xFFFFFFFF) << 32);
	}

	std::vector<uint8_t> data;
	if (!readDataAt(data, headerSizeAligned, zDataSize)) {
		return false;
	}
	decryptData(data.data(), data.size(), seed);
	if (!inflateDataIfNeeded(data, dataSize)) {
		return false;
	}

	m_dataOffset = 0;
	m_data.swap(data);

	for (auto& volumeInfo: m_volumes) {
		m_dataStreams.emplace_back();
		auto& streamDesc = m_dataStreams.back();
		{
			streamDesc.filePath = (m_basePath / volumeInfo.fileName).string();
			if (!prepareStream(streamDesc.stream, streamDesc.filePath, &streamDesc.fileSize)) {
				return false;
			}
			if (!parseExtendedHeader(streamDesc)) {
				return false;
			}
		}
	}

	return true;
}